

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.hpp
# Opt level: O0

int xercesc_4_0::XMLDateTime::getRetVal(int c1,int c2)

{
  int local_18;
  int c2_local;
  int c1_local;
  
  if (((c1 == -1) && (c2 == 1)) || ((c1 == 1 && (c2 == -1)))) {
    c2_local = 2;
  }
  else {
    local_18 = c2;
    if (c1 != 2) {
      local_18 = c1;
    }
    c2_local = local_18;
  }
  return c2_local;
}

Assistant:

inline int XMLDateTime::getRetVal(int c1, int c2)
{
    if ((c1 == LESS_THAN    && c2 == GREATER_THAN) ||
        (c1 == GREATER_THAN && c2 == LESS_THAN)      )
    {
        return INDETERMINATE;
    }

    return ( c1 != INDETERMINATE ) ? c1 : c2;
}